

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O0

pair<std::_List_iterator<Item>,_bool> __thiscall State::insertClosure(State *this,Item *item)

{
  bool bVar1;
  iterator __last;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  _List_iterator<Item> in_RSI;
  const_iterator in_RDI;
  long in_FS_OFFSET;
  pair<std::_List_iterator<Item>,_bool> pVar3;
  ItemPointer it;
  Item *in_stack_ffffffffffffff80;
  bool local_41;
  _List_const_iterator<Item> local_40;
  _List_iterator<Item> local_38;
  bool local_29;
  _Self local_28;
  _Self local_20;
  pair<std::_List_iterator<Item>,_bool> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
  __last = std::__cxx11::list<Item,_std::allocator<Item>_>::begin
                     ((list<Item,_std::allocator<Item>_> *)in_stack_ffffffffffffff80);
  std::__cxx11::list<Item,_std::allocator<Item>_>::end
            ((list<Item,_std::allocator<Item>_> *)in_stack_ffffffffffffff80);
  local_20._M_node =
       (_List_node_base *)
       std::find<std::_List_iterator<Item>,Item>(in_RSI,__last._M_node,in_stack_ffffffffffffff80);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<Item,_std::allocator<Item>_>::end
                 ((list<Item,_std::allocator<Item>_> *)in_stack_ffffffffffffff80);
  bVar1 = std::operator!=(&local_20,&local_28);
  if (bVar1) {
    local_29 = false;
    std::pair<std::_List_iterator<Item>,_bool>::pair<std::_List_iterator<Item>_&,_bool,_true>
              (&local_18,&local_20,&local_29);
    uVar2 = extraout_RDX;
  }
  else {
    std::_List_const_iterator<Item>::_List_const_iterator(&local_40,&local_20);
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::list<Item,_std::allocator<Item>_>::insert
                   (in_RSI._M_node,in_RDI,__last._M_node);
    local_41 = true;
    std::pair<std::_List_iterator<Item>,_bool>::pair<std::_List_iterator<Item>,_bool,_true>
              (&local_18,&local_38,&local_41);
    uVar2 = extraout_RDX_00;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    pVar3._9_7_ = (undefined7)((ulong)uVar2 >> 8);
    pVar3.second = local_18.second;
    pVar3.first._M_node = local_18.first._M_node;
    return pVar3;
  }
  __stack_chk_fail();
}

Assistant:

std::pair<ItemPointer, bool> State::insertClosure(const Item &item)
{
  ItemPointer it = std::find (closure.begin (), closure.end (), item);

  if (it != closure.end ())
    return {it, false};

  return {closure.insert (it, item), true};
}